

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

uint32_t handleQuantizeEqualExp(uint32_t abssrc,uint32_t tolSig,float errTol,float srcFloat)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint in_ESI;
  uint in_EDI;
  float in_XMM0_Da;
  float fVar4;
  float in_XMM1_Da;
  uint32_t alt1;
  uint32_t alt0;
  float smalldelta;
  float delta;
  int smallbits;
  int bits;
  uint32_t smallest;
  uint32_t alt;
  uint32_t mask3;
  uint32_t extrabit;
  uint32_t srcMaskedVal;
  uint32_t mask2;
  uint32_t mask;
  uint32_t lowermask;
  uint32_t npow2;
  uint local_48;
  float local_44;
  int local_3c;
  uint local_34;
  
  uVar1 = (uint)((in_EDI & 0x7ff) < in_ESI);
  uVar1 = (uVar1 << 0xc | (uint)((uVar1 != 0 ^ 0xffU) & 1) << 10) ^ 0xfffff000;
  local_3c = countSetBits((uint16_t)in_EDI);
  if ((in_EDI & 0x7ff) == in_EDI) {
    uVar1 = in_EDI & uVar1;
    iVar2 = countSetBits((uint16_t)uVar1);
    if (iVar2 < local_3c) {
      fVar4 = half_to_float(0);
      local_44 = in_XMM0_Da;
      local_34 = in_EDI;
      if (in_XMM1_Da - fVar4 < in_XMM0_Da) {
        local_44 = in_XMM1_Da - fVar4;
        local_3c = iVar2;
        local_34 = uVar1;
      }
    }
    else {
      local_44 = in_XMM0_Da;
      local_34 = in_EDI;
      if (iVar2 == local_3c) {
        fVar4 = half_to_float(0);
        local_44 = in_XMM0_Da;
        local_34 = in_EDI;
        if (in_XMM1_Da - fVar4 < in_XMM0_Da) {
          local_44 = in_XMM1_Da - fVar4;
          local_3c = iVar2;
          local_34 = uVar1;
        }
      }
    }
  }
  else {
    local_48 = in_EDI & 0xfffff000;
    uVar3 = in_EDI & 0xfffff800;
    if (local_48 == uVar3) {
      local_48 = in_EDI & uVar1;
    }
    iVar2 = countSetBits((uint16_t)local_48);
    local_34 = in_EDI;
    if (iVar2 < local_3c) {
      fVar4 = half_to_float(0);
      local_44 = in_XMM0_Da;
      if (in_XMM1_Da - fVar4 < in_XMM0_Da) {
        local_34 = local_48;
        local_44 = in_XMM1_Da - fVar4;
        local_3c = iVar2;
      }
    }
    else {
      local_44 = in_XMM0_Da;
      if (iVar2 == local_3c) {
        fVar4 = half_to_float(0);
        local_44 = in_XMM0_Da;
        if (in_XMM1_Da - fVar4 < in_XMM0_Da) {
          local_34 = local_48;
          local_44 = in_XMM1_Da - fVar4;
          local_3c = iVar2;
        }
      }
    }
    iVar2 = countSetBits((uint16_t)uVar3);
    if (iVar2 < local_3c) {
      fVar4 = half_to_float(0);
      if (in_XMM1_Da - fVar4 < in_XMM0_Da) {
        local_44 = in_XMM1_Da - fVar4;
        local_3c = iVar2;
        local_34 = uVar3;
      }
    }
    else if (iVar2 == local_3c) {
      fVar4 = half_to_float(0);
      if (in_XMM1_Da - fVar4 < local_44) {
        local_44 = in_XMM1_Da - fVar4;
        local_3c = iVar2;
        local_34 = uVar3;
      }
    }
  }
  uVar1 = in_EDI + 0x800 & 0xfffff800;
  iVar2 = countSetBits((uint16_t)uVar1);
  if (iVar2 < local_3c) {
    fVar4 = half_to_float(0);
    if (fVar4 - in_XMM1_Da < in_XMM0_Da) {
      local_34 = uVar1;
    }
  }
  else if ((iVar2 == local_3c) && (fVar4 = half_to_float(0), fVar4 - in_XMM1_Da < local_44)) {
    local_34 = uVar1;
  }
  return local_34;
}

Assistant:

static uint32_t handleQuantizeEqualExp (
    uint32_t abssrc, uint32_t tolSig, float errTol, float srcFloat)
{
    const uint32_t npow2 = 0x0800;
    const uint32_t lowermask = npow2 - 1;
    const uint32_t mask = ~lowermask;
    const uint32_t mask2 = mask ^ npow2;

    const uint32_t srcMaskedVal = abssrc & lowermask;
    const uint32_t extrabit = (tolSig > srcMaskedVal);

    const uint32_t mask3 = mask2 ^ (((npow2 << 1) * (extrabit)) |
                                    ((npow2 >> 1) * (!extrabit)));

    // not yet clear how to narrow down below 3 values...
    uint32_t alt, smallest = abssrc;
    int bits, smallbits = countSetBits(abssrc);
    float delta, smalldelta = errTol;

    // doing in this order mask2, mask, +npow guarantees sorting of values
    // so can avoid a couple of conditionals in the macros
    if (srcMaskedVal == abssrc)
    {
        TEST_QUANT_ALTERNATE_SMALL(abssrc & mask3);
    }
    else
    {
        uint32_t alt0 = (abssrc & mask2);
        uint32_t alt1 = (abssrc & mask);
        if (alt0 == alt1) alt0 = (abssrc & mask3);

        TEST_QUANT_ALTERNATE_SMALL(alt0);
        TEST_QUANT_ALTERNATE_SMALL(alt1);
    }
    TEST_QUANT_ALTERNATE_LARGE((abssrc + npow2) & mask);

    return smallest;
}